

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  if ((pList != (SrcList *)0x0) && (0 < pList->nSrc)) {
    piVar3 = &pList->a[0].iCursor;
    iVar2 = 0;
    do {
      if (*piVar3 < 0) {
        iVar1 = pParse->nTab;
        pParse->nTab = iVar1 + 1;
        *piVar3 = iVar1;
        if (*(Select **)(piVar3 + -6) != (Select *)0x0) {
          sqlite3SrcListAssignCursors(pParse,(*(Select **)(piVar3 + -6))->pSrc);
        }
      }
      iVar2 = iVar2 + 1;
      piVar3 = piVar3 + 0x1a;
    } while (iVar2 < pList->nSrc);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->pSelect ){
        sqlite3SrcListAssignCursors(pParse, pItem->pSelect->pSrc);
      }
    }
  }
}